

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cc
# Opt level: O0

void __thiscall brown::Tile::Tile(Tile *this,int x,int y,uint32_t fill)

{
  int local_20;
  int i;
  uint32_t fill_local;
  int y_local;
  int x_local;
  Tile *this_local;
  
  Tile(this,x,y);
  for (local_20 = 0; local_20 < x * y; local_20 = local_20 + 1) {
    *(uint32_t *)(this->f + (long)local_20 * 4) = fill;
  }
  return;
}

Assistant:

Tile::Tile(int x, int y, std::uint32_t fill):
    Tile(x, y) {
    for (int i = 0; i <  x*y; i++) {
        reinterpret_cast<std::uint32_t*>(f)[i] = fill;
    }
}